

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

size_t __thiscall Fossilize::ScratchAllocator::get_peak_memory_consumption(ScratchAllocator *this)

{
  Impl *this_00;
  bool bVar1;
  reference pBVar2;
  size_type sVar3;
  Block *block;
  iterator __end1;
  iterator __begin1;
  vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
  *__range1;
  size_t current_size;
  ScratchAllocator *this_local;
  
  __range1 = (vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
              *)0x0;
  this_00 = this->impl;
  __end1 = std::
           vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
           ::begin(&this_00->blocks);
  block = (Block *)std::
                   vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                   ::end(&this_00->blocks);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
                                *)&block);
    if (!bVar1) break;
    pBVar2 = __gnu_cxx::
             __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
             ::operator*(&__end1);
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pBVar2->blob);
    __range1 = (vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                *)((long)&(__range1->
                          super__Vector_base<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
                          )._M_impl.super__Vector_impl_data._M_start + sVar3);
    __gnu_cxx::
    __normal_iterator<Fossilize::ScratchAllocator::Impl::Block_*,_std::vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>_>
    ::operator++(&__end1);
  }
  if (__range1 <
      (vector<Fossilize::ScratchAllocator::Impl::Block,_std::allocator<Fossilize::ScratchAllocator::Impl::Block>_>
       *)this->impl->peak_history_size) {
    this_local = (ScratchAllocator *)this->impl->peak_history_size;
  }
  else {
    this_local = (ScratchAllocator *)__range1;
  }
  return (size_t)this_local;
}

Assistant:

size_t ScratchAllocator::get_peak_memory_consumption() const
{
	size_t current_size = 0;
	for (auto &block : impl->blocks)
		current_size += block.blob.size();

	if (impl->peak_history_size > current_size)
		return impl->peak_history_size;
	else
		return current_size;
}